

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O3

char * macro_GetAllArgs(void)

{
  char *__s;
  MacroArgs *pMVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  uint32_t i_1;
  ulong uVar8;
  char *__dest;
  uint32_t i;
  ulong uVar9;
  
  pMVar1 = macroArgs;
  if (macroArgs == (MacroArgs *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    uVar2 = macroArgs->nbArgs;
    uVar8 = (ulong)macroArgs->shift;
    if (macroArgs->shift < uVar2) {
      lVar7 = 0;
      uVar9 = uVar8;
      do {
        sVar3 = strlen(*(char **)(&pMVar1[1].nbArgs + uVar9 * 2));
        lVar6 = lVar7 + sVar3;
        lVar7 = lVar6 + 1;
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
      pcVar4 = (char *)malloc(lVar6 + 2);
      __dest = pcVar4;
      if (pcVar4 == (char *)0x0) {
        piVar5 = __errno_location();
        pcVar4 = strerror(*piVar5);
        fatalerror("Failed to allocate memory for expanding \'\\#\': %s\n",pcVar4);
      }
      do {
        __s = *(char **)(&pMVar1[1].nbArgs + uVar8 * 2);
        sVar3 = strlen(__s);
        memcpy(__dest,__s,sVar3);
        __dest = __dest + sVar3;
        uVar2 = pMVar1->nbArgs;
        if ((uVar8 < uVar2 - 1) || (sVar3 == 0)) {
          *__dest = ',';
          __dest = __dest + 1;
          uVar2 = pMVar1->nbArgs;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < uVar2);
      *__dest = '\0';
    }
    else {
      pcVar4 = "";
    }
  }
  return pcVar4;
}

Assistant:

char const *macro_GetAllArgs(void)
{
	if (!macroArgs)
		return NULL;

	if (macroArgs->shift >= macroArgs->nbArgs)
		return "";

	size_t len = 0;

	for (uint32_t i = macroArgs->shift; i < macroArgs->nbArgs; i++)
		len += strlen(macroArgs->args[i]) + 1; // 1 for comma

	char *str = (char *)malloc(len + 1); // 1 for '\0'
	char *ptr = str;

	if (!str)
		fatalerror("Failed to allocate memory for expanding '\\#': %s\n", strerror(errno));

	for (uint32_t i = macroArgs->shift; i < macroArgs->nbArgs; i++) {
		size_t n = strlen(macroArgs->args[i]);

		memcpy(ptr, macroArgs->args[i], n);
		ptr += n;

		// Commas go between args and after a last empty arg
		if (i < macroArgs->nbArgs - 1 || n == 0)
			*ptr++ = ','; // no space after comma
	}
	*ptr = '\0';

	return str;
}